

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O2

void scale_rows(Runtime *rt)

{
  mapped_type_conflict1 *pmVar1;
  ulong uVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefperrow;
  int local_6c;
  double local_68;
  undefined8 uStack_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  if ((rt->settings).rowscaling == true) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    for (local_6c = 0; local_6c < (rt->scaled).num_con; local_6c = local_6c + 1) {
      pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,&local_6c);
      *pmVar1 = 0.0;
    }
    lVar6 = 0;
    while (uVar2 = (ulong)(rt->scaled).num_var, lVar6 < (long)uVar2) {
      piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)piVar3[lVar6];
      lVar6 = lVar6 + 1;
      lVar5 = lVar4 * 4;
      for (; lVar4 < piVar3[lVar6]; lVar4 = lVar4 + 1) {
        local_68 = *(double *)
                    ((long)(rt->scaled).A.mat.value.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar5 * 2);
        uStack_60 = 0;
        pmVar1 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,
                            (key_type_conflict1 *)
                            ((long)(rt->scaled).A.mat.index.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar5));
        if (*pmVar1 <= ABS(local_68) && ABS(local_68) != *pmVar1) {
          local_68 = *(mapped_type_conflict1 *)
                      ((long)(rt->scaled).A.mat.value.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar5 * 2);
          uStack_60 = 0;
          pmVar1 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_58,
                                (key_type_conflict1 *)
                                ((long)(rt->scaled).A.mat.index.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar5));
          *pmVar1 = ABS(local_68);
        }
        piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 4;
      }
    }
    lVar6 = 0;
    while (lVar6 < (int)uVar2) {
      piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)piVar3[lVar6];
      lVar6 = lVar6 + 1;
      lVar5 = lVar4 * 4;
      for (; lVar4 < piVar3[lVar6]; lVar4 = lVar4 + 1) {
        pmVar1 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,
                            (key_type_conflict1 *)
                            ((long)(rt->scaled).A.mat.index.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar5));
        log2(*pmVar1);
        piVar3 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 4;
      }
      uVar2 = (ulong)(uint)(rt->scaled).num_var;
    }
    for (local_6c = 0; local_6c < (rt->scaled).num_con; local_6c = local_6c + 1) {
      pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,&local_6c);
      log2(*pmVar1);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_58);
  }
  return;
}

Assistant:

static void scale_rows(Runtime& rt) {
  if (!rt.settings.rowscaling) {
    return;
  }

  std::map<HighsInt, double> maxabscoefperrow;
  for (HighsInt row = 0; row < rt.scaled.num_con; row++) {
    maxabscoefperrow[row] = 0.0;
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      if (fabs(rt.scaled.A.mat.value[index]) >
          maxabscoefperrow[rt.scaled.A.mat.index[index]]) {
        maxabscoefperrow[rt.scaled.A.mat.index[index]] =
            fabs(rt.scaled.A.mat.value[index]);
      }
    }
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      double factor =
          largestpoweroftwo(maxabscoefperrow[rt.scaled.A.mat.index[index]]);
      rt.scaled.A.mat.value[index] /= factor;
    }
  }

  for (HighsInt row = 0; row < rt.scaled.num_con; row++) {
    double factor = largestpoweroftwo(maxabscoefperrow[row]);
    if (rt.scaled.con_lo[row] > -std::numeric_limits<double>::infinity()) {
      rt.scaled.con_lo[row] /= factor;
    }
    if (rt.scaled.con_up[row] < std::numeric_limits<double>::infinity()) {
      rt.scaled.con_up[row] /= factor;
    }
  }
}